

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::FieldMask::_InternalSerialize
          (FieldMask *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  size_t __n;
  ulong uVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar3;
  uint8_t *puVar4;
  int index;
  char *in_R9;
  string_view s;
  string_view field_name;
  
  iVar1 = *(int *)((long)&this->field_0 + 8);
  if (0 < iVar1) {
    index = 0;
    do {
      pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)&(this->field_0)._impl_,index);
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)"google.protobuf.FieldMask.paths";
      protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)(pVVar3->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)pVVar3->_M_string_length,1,0x1f,field_name);
      __n = pVVar3->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\n';
        target[1] = (uint8_t)__n;
        memcpy(target + 2,(pVVar3->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        s._M_str = (pVVar3->_M_dataplus)._M_p;
        s._M_len = __n;
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,target);
      }
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    puVar4 = protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FieldMask::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FieldMask& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldMask)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated string paths = 1;
  for (int i = 0, n = this_._internal_paths_size(); i < n; ++i) {
    const auto& s = this_._internal_paths().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.FieldMask.paths");
    target = stream->WriteString(1, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldMask)
  return target;
}